

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexConcaveCollisionAlgorithm.cpp
# Opt level: O1

cbtScalar __thiscall
cbtConvexConcaveCollisionAlgorithm::calculateTimeOfImpact
          (cbtConvexConcaveCollisionAlgorithm *this,cbtCollisionObject *body0,
          cbtCollisionObject *body1,cbtDispatcherInfo *dispatchInfo,cbtManifoldResult *resultOut)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  cbtCollisionShape *pcVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [4];
  undefined1 auVar12 [12];
  cbtCollisionObject *pcVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  cbtTransform triInv;
  undefined1 local_188 [4];
  undefined1 auStack_184 [8];
  float fStack_17c;
  undefined1 local_178 [4];
  undefined1 auStack_174 [8];
  float fStack_16c;
  cbtScalar local_164;
  cbtScalar local_160;
  cbtScalar local_15c;
  cbtScalar local_158;
  cbtScalar local_154;
  cbtScalar local_150;
  cbtScalar local_14c;
  cbtScalar local_148;
  cbtScalar local_144;
  cbtScalar local_140;
  cbtScalar local_13c;
  undefined1 local_138 [16];
  uint local_120;
  uint local_11c;
  uint uStack_118;
  uint local_110;
  uint local_10c;
  uint uStack_108;
  uint local_100;
  float local_fc;
  uint local_f8;
  float local_f0;
  float local_ec;
  float local_e8;
  cbtTriangleCallback local_e0;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined1 local_68 [16];
  float local_18;
  cbtScalar local_14;
  
  pcVar13 = body0;
  if (this->m_isSwapped != false) {
    pcVar13 = body1;
  }
  fVar9 = (pcVar13->m_interpolationWorldTransform).m_origin.m_floats[1] -
          (pcVar13->m_worldTransform).m_origin.m_floats[1];
  auVar14 = ZEXT416((uint)((pcVar13->m_interpolationWorldTransform).m_origin.m_floats[0] -
                          (pcVar13->m_worldTransform).m_origin.m_floats[0]));
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar9)),auVar14,auVar14);
  auVar15 = ZEXT416((uint)((pcVar13->m_interpolationWorldTransform).m_origin.m_floats[2] -
                          (pcVar13->m_worldTransform).m_origin.m_floats[2]));
  auVar14 = vfmadd231ss_fma(auVar14,auVar15,auVar15);
  if (pcVar13->m_ccdMotionThreshold * pcVar13->m_ccdMotionThreshold <= auVar14._0_4_) {
    if (this->m_isSwapped != false) {
      body1 = body0;
    }
    cbtTransform::inverse(&body1->m_worldTransform);
    if (10 < body1->m_collisionShape->m_shapeType - 0x19U) {
      return 1.0;
    }
    cVar1 = (pcVar13->m_worldTransform).m_basis.m_el[1].m_floats[0];
    local_150 = (pcVar13->m_worldTransform).m_basis.m_el[0].m_floats[0];
    local_14c = (pcVar13->m_worldTransform).m_basis.m_el[0].m_floats[1];
    local_13c = (pcVar13->m_worldTransform).m_basis.m_el[2].m_floats[0];
    cVar2 = (pcVar13->m_worldTransform).m_basis.m_el[1].m_floats[1];
    local_140 = (pcVar13->m_worldTransform).m_basis.m_el[2].m_floats[1];
    local_154 = (pcVar13->m_worldTransform).m_basis.m_el[0].m_floats[2];
    cVar3 = (pcVar13->m_worldTransform).m_basis.m_el[1].m_floats[2];
    local_144 = (pcVar13->m_worldTransform).m_basis.m_el[2].m_floats[2];
    cVar4 = (pcVar13->m_worldTransform).m_origin.m_floats[0];
    fVar9 = (pcVar13->m_worldTransform).m_origin.m_floats[1];
    auVar14 = vmulss_avx512f(ZEXT416(local_11c),ZEXT416((uint)fVar9));
    auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)cVar4),ZEXT416(local_120));
    cVar5 = (pcVar13->m_worldTransform).m_origin.m_floats[2];
    auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)cVar5),ZEXT416(uStack_118));
    auVar15 = vmulss_avx512f(ZEXT416(local_10c),ZEXT416((uint)fVar9));
    auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)cVar4),ZEXT416(local_110));
    auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)cVar5),ZEXT416(uStack_108));
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_fc * fVar9)),ZEXT416(local_100),
                              ZEXT416((uint)cVar4));
    auVar16 = vfmadd231ss_fma(auVar16,ZEXT416(local_f8),ZEXT416((uint)cVar5));
    auVar14 = vinsertps_avx(ZEXT416((uint)(local_f0 + auVar14._0_4_)),
                            ZEXT416((uint)(auVar15._0_4_ + local_ec)),0x10);
    auVar15._4_8_ = SUB128(ZEXT812(0),4);
    auVar15._0_4_ = auVar16._0_4_ + local_e8;
    auVar15._12_4_ = 0;
    local_138 = vmovlhps_avx512f(auVar14,auVar15);
    local_160 = (pcVar13->m_interpolationWorldTransform).m_basis.m_el[0].m_floats[0];
    cVar4 = (pcVar13->m_interpolationWorldTransform).m_basis.m_el[1].m_floats[0];
    local_148 = (pcVar13->m_interpolationWorldTransform).m_basis.m_el[2].m_floats[0];
    local_164 = (pcVar13->m_interpolationWorldTransform).m_basis.m_el[0].m_floats[1];
    cVar5 = (pcVar13->m_interpolationWorldTransform).m_basis.m_el[1].m_floats[1];
    cVar6 = (pcVar13->m_interpolationWorldTransform).m_origin.m_floats[0];
    fVar9 = (pcVar13->m_interpolationWorldTransform).m_origin.m_floats[1];
    auVar14 = vmulss_avx512f(ZEXT416(local_11c),ZEXT416((uint)fVar9));
    auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)cVar6),ZEXT416(local_120));
    auVar15 = vmulss_avx512f(ZEXT416(local_10c),ZEXT416((uint)fVar9));
    auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)cVar6),ZEXT416(local_110));
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_fc * fVar9)),ZEXT416(local_100),
                              ZEXT416((uint)cVar6));
    cVar6 = (pcVar13->m_interpolationWorldTransform).m_origin.m_floats[2];
    auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)cVar6),ZEXT416(uStack_118));
    auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)cVar6),ZEXT416(uStack_108));
    auVar16 = vfmadd231ss_fma(auVar16,ZEXT416(local_f8),ZEXT416((uint)cVar6));
    local_158 = (pcVar13->m_interpolationWorldTransform).m_basis.m_el[2].m_floats[1];
    local_f0 = auVar14._0_4_ + local_f0;
    cVar6 = (pcVar13->m_interpolationWorldTransform).m_basis.m_el[0].m_floats[2];
    auVar15 = vaddss_avx512f(ZEXT416((uint)local_ec),auVar15);
    cVar7 = (pcVar13->m_interpolationWorldTransform).m_basis.m_el[1].m_floats[2];
    local_15c = (pcVar13->m_interpolationWorldTransform).m_basis.m_el[2].m_floats[2];
    local_178 = local_138._0_4_;
    auVar11 = local_178;
    _auStack_174 = local_138._4_12_;
    auVar12 = _auStack_174;
    auVar14 = local_138;
    if (local_f0 < (float)local_178) {
      local_178 = (undefined1  [4])local_f0;
      auVar14 = _local_178;
    }
    _local_178 = auVar14;
    auVar14 = vaddss_avx512f(ZEXT416((uint)local_e8),auVar16);
    vucomiss_avx512f(auVar15);
    if (local_f0 < (float)auVar11) {
      auStack_174._0_4_ = auVar15._0_4_;
    }
    vucomiss_avx512f(auVar14);
    if (local_f0 < (float)auVar11) {
      auStack_174._4_4_ = auVar14._0_4_;
    }
    if (0.0 < fStack_16c) {
      fStack_16c = 0.0;
    }
    auVar14 = _local_178;
    _local_188 = local_138;
    if ((float)auVar11 < local_f0) {
      _auStack_184 = auVar12;
      local_188 = (undefined1  [4])local_f0;
    }
    auVar25 = ZEXT416(local_11c);
    auVar16 = vmulss_avx512f(ZEXT416((uint)cVar1),auVar25);
    auVar17 = vmulss_avx512f(auVar25,ZEXT416((uint)cVar2));
    auVar18 = vmulss_avx512f(auVar25,ZEXT416((uint)cVar3));
    auVar28 = ZEXT416(local_10c);
    auVar19 = vmulss_avx512f(ZEXT416((uint)cVar1),auVar28);
    auVar20 = vmulss_avx512f(ZEXT416((uint)cVar2),auVar28);
    auVar21 = vmulss_avx512f(ZEXT416((uint)cVar3),auVar28);
    auVar15 = ZEXT416((uint)local_fc);
    auVar22 = vmulss_avx512f(ZEXT416((uint)cVar1),auVar15);
    auVar23 = vmulss_avx512f(ZEXT416((uint)cVar2),auVar15);
    auVar24 = vmulss_avx512f(ZEXT416((uint)cVar3),auVar15);
    auVar25 = vmulss_avx512f(auVar25,ZEXT416((uint)cVar4));
    auVar26 = vmulss_avx512f(ZEXT416(local_11c),ZEXT416((uint)cVar5));
    auVar27 = vmulss_avx512f(ZEXT416(local_11c),ZEXT416((uint)cVar7));
    auVar28 = vmulss_avx512f(auVar28,ZEXT416((uint)cVar4));
    auVar29 = vmulss_avx512f(ZEXT416(local_10c),ZEXT416((uint)cVar5));
    auVar30 = vmulss_avx512f(ZEXT416(local_10c),ZEXT416((uint)cVar7));
    auVar31 = vmulss_avx512f(auVar15,ZEXT416((uint)cVar4));
    auVar32 = vmulss_avx512f(ZEXT416((uint)local_fc),ZEXT416((uint)cVar5));
    auVar33 = vmulss_avx512f(ZEXT416((uint)local_fc),ZEXT416((uint)cVar7));
    auVar15 = vucomiss_avx512f(ZEXT416((uint)auStack_184._0_4_));
    if ((float)auVar11 < local_f0) {
      auStack_184._0_4_ = auVar15._0_4_;
    }
    auVar34 = ZEXT416(local_120);
    auVar10 = vfmadd231ss_fma(auVar16,ZEXT416((uint)local_150),auVar34);
    auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)local_14c),auVar34);
    auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)local_154),auVar34);
    auVar35 = ZEXT416(local_110);
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)local_150),auVar35);
    auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)local_14c),auVar35);
    auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)local_154),auVar35);
    auVar16 = ZEXT416(local_100);
    auVar22 = vfmadd231ss_avx512f(auVar22,auVar16,ZEXT416((uint)local_150));
    auVar23 = vfmadd231ss_avx512f(auVar23,auVar16,ZEXT416((uint)local_14c));
    auVar24 = vfmadd231ss_avx512f(auVar24,auVar16,ZEXT416((uint)local_154));
    auVar25 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)local_160),auVar34);
    auVar26 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)local_164),ZEXT416(local_120));
    auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)cVar6),ZEXT416(local_120));
    auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)local_160),auVar35);
    auVar29 = vfmadd231ss_avx512f(auVar29,ZEXT416((uint)local_164),ZEXT416(local_110));
    auVar30 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)cVar6),ZEXT416(local_110));
    auVar31 = vfmadd231ss_avx512f(auVar31,auVar16,ZEXT416((uint)local_160));
    auVar32 = vfmadd231ss_avx512f(auVar32,ZEXT416(local_100),ZEXT416((uint)local_164));
    auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)cVar6),ZEXT416(local_100));
    auVar16 = vucomiss_avx512f(ZEXT416((uint)auStack_184._4_4_));
    if ((float)auVar11 < local_f0) {
      auStack_184._4_4_ = auVar16._0_4_;
    }
    auVar35 = ZEXT416(uStack_118);
    auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)local_13c),auVar35);
    auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)local_140),auVar35);
    auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)local_144),auVar35);
    auVar36 = ZEXT416(uStack_108);
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)local_13c),auVar36);
    auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)local_140),auVar36);
    auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)local_144),auVar36);
    auVar34 = ZEXT416(local_f8);
    auVar22 = vfmadd231ss_avx512f(auVar22,auVar34,ZEXT416((uint)local_13c));
    auVar23 = vfmadd231ss_avx512f(auVar23,auVar34,ZEXT416((uint)local_140));
    auVar24 = vfmadd231ss_avx512f(auVar24,auVar34,ZEXT416((uint)local_144));
    auVar25 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)local_148),auVar35);
    auVar26 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)local_158),ZEXT416(uStack_118));
    auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)local_15c),ZEXT416(uStack_118));
    auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)local_148),auVar36);
    auVar29 = vfmadd231ss_avx512f(auVar29,ZEXT416((uint)local_158),ZEXT416(uStack_108));
    auVar30 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)local_15c),ZEXT416(uStack_108));
    auVar31 = vfmadd231ss_avx512f(auVar31,auVar34,ZEXT416((uint)local_148));
    auVar32 = vfmadd231ss_avx512f(auVar32,ZEXT416(local_f8),ZEXT416((uint)local_158));
    auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)local_15c),ZEXT416(local_f8));
    auVar15 = vinsertps_avx512f(ZEXT416((uint)local_f0),auVar15,0x10);
    if (fStack_17c < 0.0) {
      fStack_17c = 0.0;
    }
    auVar34 = _local_188;
    local_18 = pcVar13->m_ccdSweptSphereRadius;
    auStack_174._0_4_ = (float)auStack_174._0_4_ - local_18;
    local_178 = (undefined1  [4])((float)local_178 - local_18);
    auStack_174._4_4_ = auVar14._8_4_;
    fStack_16c = auVar14._12_4_;
    auStack_174._4_4_ = (float)auStack_174._4_4_ - local_18;
    auStack_184._0_4_ = local_18 + (float)auStack_184._0_4_;
    local_188 = (undefined1  [4])(local_18 + (float)local_188);
    auStack_184._4_4_ = auVar34._8_4_;
    fStack_17c = auVar34._12_4_;
    auStack_184._4_4_ = local_18 + (float)auStack_184._4_4_;
    local_e0._vptr_cbtTriangleCallback = (_func_int **)&PTR__cbtTriangleCallback_00b705f8;
    local_d8 = auVar10._0_4_;
    local_d4 = auVar17._0_4_;
    local_d0 = auVar18._0_4_;
    local_cc = 0;
    local_c8 = auVar19._0_4_;
    local_c4 = auVar20._0_4_;
    local_c0 = auVar21._0_4_;
    local_bc = 0;
    local_b8 = auVar22._0_4_;
    local_b4 = auVar23._0_4_;
    local_b0 = auVar24._0_4_;
    local_ac = 0;
    local_a8 = local_138._0_8_;
    uStack_a0 = local_138._8_8_;
    local_98 = auVar25._0_4_;
    local_94 = auVar26._0_4_;
    local_90 = auVar27._0_4_;
    local_8c = 0;
    local_88 = auVar28._0_4_;
    local_84 = auVar29._0_4_;
    local_80 = auVar30._0_4_;
    local_7c = 0;
    local_78 = auVar31._0_4_;
    local_74 = auVar32._0_4_;
    local_70 = auVar33._0_4_;
    local_6c = 0;
    local_68 = vmovlhps_avx(auVar15,ZEXT416(auVar16._0_4_));
    local_14 = pcVar13->m_hitFraction;
    pcVar8 = body1->m_collisionShape;
    if (pcVar8 != (cbtCollisionShape *)0x0) {
      (*pcVar8->_vptr_cbtCollisionShape[0x10])(pcVar8,&local_e0,local_178,local_188);
    }
    if (local_14 < pcVar13->m_hitFraction) {
      pcVar13->m_hitFraction = local_14;
      local_138._0_4_ = local_14;
      cbtTriangleCallback::~cbtTriangleCallback(&local_e0);
      return (cbtScalar)local_138._0_4_;
    }
    cbtTriangleCallback::~cbtTriangleCallback(&local_e0);
  }
  return 1.0;
}

Assistant:

cbtScalar cbtConvexConcaveCollisionAlgorithm::calculateTimeOfImpact(cbtCollisionObject* body0, cbtCollisionObject* body1, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	(void)resultOut;
	(void)dispatchInfo;
	cbtCollisionObject* convexbody = m_isSwapped ? body1 : body0;
	cbtCollisionObject* triBody = m_isSwapped ? body0 : body1;

	//quick approximation using raycast, todo: hook up to the continuous collision detection (one of the cbtConvexCast)

	//only perform CCD above a certain threshold, this prevents blocking on the long run
	//because object in a blocked ccd state (hitfraction<1) get their linear velocity halved each frame...
	cbtScalar squareMot0 = (convexbody->getInterpolationWorldTransform().getOrigin() - convexbody->getWorldTransform().getOrigin()).length2();
	if (squareMot0 < convexbody->getCcdSquareMotionThreshold())
	{
		return cbtScalar(1.);
	}

	//const cbtVector3& from = convexbody->m_worldTransform.getOrigin();
	//cbtVector3 to = convexbody->m_interpolationWorldTransform.getOrigin();
	//todo: only do if the motion exceeds the 'radius'

	cbtTransform triInv = triBody->getWorldTransform().inverse();
	cbtTransform convexFromLocal = triInv * convexbody->getWorldTransform();
	cbtTransform convexToLocal = triInv * convexbody->getInterpolationWorldTransform();

	struct LocalTriangleSphereCastCallback : public cbtTriangleCallback
	{
		cbtTransform m_ccdSphereFromTrans;
		cbtTransform m_ccdSphereToTrans;
		cbtTransform m_meshTransform;

		cbtScalar m_ccdSphereRadius;
		cbtScalar m_hitFraction;

		LocalTriangleSphereCastCallback(const cbtTransform& from, const cbtTransform& to, cbtScalar ccdSphereRadius, cbtScalar hitFraction)
			: m_ccdSphereFromTrans(from),
			  m_ccdSphereToTrans(to),
			  m_ccdSphereRadius(ccdSphereRadius),
			  m_hitFraction(hitFraction)
		{
		}

		virtual void processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
		{
			BT_PROFILE("processTriangle");
			(void)partId;
			(void)triangleIndex;
			//do a swept sphere for now
			cbtTransform ident;
			ident.setIdentity();
			cbtConvexCast::CastResult castResult;
			castResult.m_fraction = m_hitFraction;
			cbtSphereShape pointShape(m_ccdSphereRadius);
			cbtTriangleShape triShape(triangle[0], triangle[1], triangle[2]);
			cbtVoronoiSimplexSolver simplexSolver;
			cbtSubsimplexConvexCast convexCaster(&pointShape, &triShape, &simplexSolver);
			//GjkConvexCast	convexCaster(&pointShape,convexShape,&simplexSolver);
			//ContinuousConvexCollision convexCaster(&pointShape,convexShape,&simplexSolver,0);
			//local space?

			if (convexCaster.calcTimeOfImpact(m_ccdSphereFromTrans, m_ccdSphereToTrans,
											  ident, ident, castResult))
			{
				if (m_hitFraction > castResult.m_fraction)
					m_hitFraction = castResult.m_fraction;
			}
		}
	};

	if (triBody->getCollisionShape()->isConcave())
	{
		cbtVector3 rayAabbMin = convexFromLocal.getOrigin();
		rayAabbMin.setMin(convexToLocal.getOrigin());
		cbtVector3 rayAabbMax = convexFromLocal.getOrigin();
		rayAabbMax.setMax(convexToLocal.getOrigin());
		cbtScalar ccdRadius0 = convexbody->getCcdSweptSphereRadius();
		rayAabbMin -= cbtVector3(ccdRadius0, ccdRadius0, ccdRadius0);
		rayAabbMax += cbtVector3(ccdRadius0, ccdRadius0, ccdRadius0);

		cbtScalar curHitFraction = cbtScalar(1.);  //is this available?
		LocalTriangleSphereCastCallback raycastCallback(convexFromLocal, convexToLocal,
														convexbody->getCcdSweptSphereRadius(), curHitFraction);

		raycastCallback.m_hitFraction = convexbody->getHitFraction();

		cbtCollisionObject* concavebody = triBody;

		cbtConcaveShape* triangleMesh = (cbtConcaveShape*)concavebody->getCollisionShape();

		if (triangleMesh)
		{
			triangleMesh->processAllTriangles(&raycastCallback, rayAabbMin, rayAabbMax);
		}

		if (raycastCallback.m_hitFraction < convexbody->getHitFraction())
		{
			convexbody->setHitFraction(raycastCallback.m_hitFraction);
			return raycastCallback.m_hitFraction;
		}
	}

	return cbtScalar(1.);
}